

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O1

string * __thiscall
sznet::net::Channel::eventsToString_abi_cxx11_
          (string *__return_storage_ptr__,Channel *this,sz_sock fd,int ev)

{
  ostream *poVar1;
  ostringstream local_1a0 [8];
  ostringstream oss;
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,(int)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  if ((fd & 1U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"IN ",3);
  }
  if ((fd & 2U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"PRI ",4);
  }
  if ((fd & 4U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"RDHUP ",6);
  }
  if ((fd & 8U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"OUT ",4);
  }
  if ((fd & 0x10U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"ERROR ",6);
  }
  if ((fd & 0x20U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"HUP ",4);
  }
  if ((fd & 0x40U) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"NVAL ",5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

string Channel::eventsToString(sockets::sz_sock fd, int ev)
{
	std::ostringstream oss;
	oss << fd << ": ";
	if (ev & kReadEvent)
	{
		oss << "IN ";
	}
	if (ev & kPriEvent)
	{
		oss << "PRI ";
	}
	if (ev & kRdHupEvent)
	{
		oss << "RDHUP ";
	}
	if (ev & kWriteEvent)
	{
		oss << "OUT ";
	}
	if (ev & kErrorEvent)
	{
		oss << "ERROR ";
	}
	if (ev & kHupEvent)
	{
		oss << "HUP ";
	}
	if (ev & kNvalEvent)
	{
		oss << "NVAL ";
	}
	return oss.str();
}